

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_mcode.c
# Opt level: O0

void mcode_protfail(jit_State *J)

{
  code *pcVar1;
  lua_State *L_00;
  TValue *pTVar2;
  GCstr *pGVar3;
  lua_State *L;
  lua_CFunction panic;
  jit_State *J_local;
  
  pcVar1 = *(code **)&J[-1].penalty[0x3a].val;
  if (pcVar1 != (code *)0x0) {
    L_00 = J->L;
    pTVar2 = L_00->top;
    L_00->top = pTVar2 + 1;
    pGVar3 = lj_err_str(L_00,LJ_ERR_JITPROT);
    pTVar2->u64 = (ulong)pGVar3 | 0xfffd800000000000;
    (*pcVar1)(L_00);
  }
  return;
}

Assistant:

static LJ_NOINLINE void mcode_protfail(jit_State *J)
{
  lua_CFunction panic = J2G(J)->panic;
  if (panic) {
    lua_State *L = J->L;
    setstrV(L, L->top++, lj_err_str(L, LJ_ERR_JITPROT));
    panic(L);
  }
}